

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles2::Functional::evalSequenceSideEffCase3(ShaderEvalContext *ctx)

{
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  BVec4 local_64;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Functional local_30 [16];
  Vector<int,_4> local_20;
  ShaderEvalContext *local_10;
  ShaderEvalContext *ctx_local;
  
  local_10 = ctx;
  tcu::Vector<float,_4>::swizzle(&local_40,(int)ctx + 0x30,1,2,3);
  tcu::Vector<float,_4>::swizzle(&local_60,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::asInt(&local_50);
  tcu::Vector<float,_4>::swizzle(&local_74,(int)local_10 + 0x50,0,3,2);
  tcu::Vector<float,_4>::Vector(&local_84,0.0,0.0,0.0,0.0);
  tcu::greaterThan<float,4>((tcu *)&local_64,&local_74,&local_84);
  sequenceSideEffCase3(local_30,&local_40,(IVec4 *)&local_50,&local_64);
  tcu::Vector<int,_4>::asFloat(&local_20);
  *(undefined8 *)(local_10->color).m_data = local_20.m_data._0_8_;
  *(undefined8 *)((local_10->color).m_data + 2) = local_20.m_data._8_8_;
  return;
}

Assistant:

void evalSequenceSideEffCase3	(ShaderEvalContext& ctx) { ctx.color		= sequenceSideEffCase3(ctx.in[0].swizzle(1, 2, 3, 0), ctx.in[1].swizzle(3, 2, 1, 0).asInt(), greaterThan(ctx.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }